

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidgetPrivate::scrollChildren(QWidgetPrivate *this,int dx,int dy)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  QArrayData *pQVar7;
  QWidget *this_00;
  QWidgetData *pQVar8;
  Representation RVar9;
  QPoint QVar10;
  int i;
  long lVar11;
  QWidgetPrivate *this_01;
  QPoint QVar12;
  long in_FS_OFFSET;
  QPoint oldp;
  QPoint local_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = *(long *)(*(long *)&this->field_0x8 + 8);
  lVar6 = *(long *)(lVar5 + 0x28);
  if (lVar6 != 0) {
    pQVar7 = *(QArrayData **)(lVar5 + 0x18);
    lVar5 = *(long *)(lVar5 + 0x20);
    if (pQVar7 != (QArrayData *)0x0) {
      LOCK();
      (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    lVar11 = 0;
    do {
      this_00 = *(QWidget **)(lVar5 + lVar11 * 8);
      if (((this_00 != (QWidget *)0x0) &&
          ((*(byte *)(*(long *)&this_00->field_0x8 + 0x30) & 1) != 0)) &&
         (((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 1) == 0)) {
        local_40 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
        local_40 = QWidget::pos(this_00);
        QVar10 = QWidget::pos(this_00);
        QVar12.xp.m_i = QVar10.xp.m_i.m_i + dx;
        RVar9.m_i = QVar10.yp.m_i.m_i + dy;
        pQVar8 = this_00->data;
        iVar1 = (pQVar8->crect).x2.m_i;
        iVar2 = (pQVar8->crect).x1.m_i;
        iVar3 = (pQVar8->crect).y2.m_i;
        iVar4 = (pQVar8->crect).y1.m_i;
        QVar12.yp.m_i = RVar9.m_i;
        (pQVar8->crect).x1 = (Representation)QVar12.xp.m_i;
        (pQVar8->crect).y1 = (Representation)RVar9.m_i;
        (pQVar8->crect).x2.m_i = (iVar1 + QVar12.xp.m_i) - iVar2;
        (pQVar8->crect).y2.m_i = (RVar9.m_i + iVar3) - iVar4;
        this_01 = *(QWidgetPrivate **)&this_00->field_0x8;
        if ((this_01->high_attributes[0] & 0x10000000) != 0) {
          setWSGeometry(this_01);
          this_01 = *(QWidgetPrivate **)&this_00->field_0x8;
        }
        setDirtyOpaqueRegion(this_01);
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
        local_68 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
        local_70 = QVar12;
        QMoveEvent::QMoveEvent((QMoveEvent *)&local_68,&local_70,&local_40);
        QCoreApplication::sendEvent(&this_00->super_QObject,(QEvent *)&local_68);
        QMoveEvent::~QMoveEvent((QMoveEvent *)&local_68);
      }
      lVar11 = lVar11 + 1;
    } while (lVar6 != lVar11);
    if (pQVar7 != (QArrayData *)0x0) {
      LOCK();
      (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar7,8,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::scrollChildren(int dx, int dy)
{
    Q_Q(QWidget);
    if (q->children().size() > 0) {        // scroll children
        QPoint pd(dx, dy);
        QObjectList childObjects = q->children();
        for (int i = 0; i < childObjects.size(); ++i) { // move all children
            QWidget *w = qobject_cast<QWidget*>(childObjects.at(i));
            if (w && !w->isWindow()) {
                QPoint oldp = w->pos();
                QRect  r(w->pos() + pd, w->size());
                w->data->crect = r;
                if (w->testAttribute(Qt::WA_WState_Created))
                    w->d_func()->setWSGeometry();
                w->d_func()->setDirtyOpaqueRegion();
                QMoveEvent e(r.topLeft(), oldp);
                QCoreApplication::sendEvent(w, &e);
            }
        }
    }
}